

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_vec2 nk_text_calculate_text_bounds
                  (nk_user_font *font,char *begin,int byte_len,float row_height,char **remaining,
                  nk_vec2 *out_offset,int *glyphs,int op)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  char *c;
  nk_vec2 nVar7;
  undefined4 in_XMM0_Db;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  nk_vec2 nVar10;
  nk_rune local_a0;
  float local_9c;
  int *local_98;
  char *local_90;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  nk_handle *local_70;
  ulong local_68;
  nk_vec2 *local_60;
  char **local_58;
  ulong local_50;
  float local_48;
  undefined4 uStack_44;
  
  local_a0 = 0;
  if (((font == (nk_user_font *)0x0) || (begin == (char *)0x0)) || (byte_len < 1)) {
    nVar7 = (nk_vec2)((ulong)(uint)row_height << 0x20);
  }
  else {
    local_98 = glyphs;
    local_48 = row_height;
    uStack_44 = in_XMM0_Db;
    iVar2 = nk_utf_decode(begin,&local_a0,byte_len);
    if (iVar2 == 0) {
      nVar7.x = 0.0;
      nVar7.y = 0.0;
    }
    else {
      local_70 = &font->userdata;
      local_60 = out_offset;
      local_58 = remaining;
      local_9c = (*font->width)(font->userdata,font->height,begin,iVar2);
      *local_98 = 0;
      local_50 = (ulong)(byte_len - 1);
      iVar3 = 0;
      local_88 = 0.0;
      uStack_84 = 0;
      uStack_80 = 0;
      uStack_7c = 0;
      local_90 = begin;
      local_68 = (ulong)(uint)byte_len;
      while( true ) {
        lVar6 = (long)iVar3;
        lVar4 = lVar6 << 0x20;
        iVar5 = -iVar3;
        while( true ) {
          auVar8 = ZEXT816(0);
          if (((long)(ulong)(uint)byte_len <= lVar6) || (iVar2 == 0)) goto LAB_0012c104;
          if (local_a0 != 0xd) break;
          *local_98 = *local_98 + 1;
          lVar1 = lVar6 + 1;
          lVar6 = lVar6 + 1;
          iVar2 = nk_utf_decode(begin + lVar1,&local_a0,(int)local_50 + iVar5);
          lVar4 = lVar4 + 0x100000000;
          iVar5 = iVar5 + -1;
        }
        if (local_a0 == 10) break;
        *local_98 = *local_98 + 1;
        iVar3 = iVar2 - iVar5;
        local_88 = local_88 + local_9c;
        c = local_90 + iVar3;
        iVar2 = nk_utf_decode(c,&local_a0,((int)local_68 - iVar2) + iVar5);
        local_9c = (*(code *)local_70[2])(*local_70,(float)local_70[1].id,c,iVar2);
      }
      if (local_88 <= 0.0) {
        local_88 = 0.0;
      }
      *local_98 = *local_98 + 1;
      auVar8._4_4_ = local_48 + 0.0;
      auVar8._0_4_ = local_88;
      auVar8._8_4_ = uStack_84;
      auVar8._12_4_ = uStack_44;
      local_88 = 0.0;
LAB_0012c104:
      nVar7 = auVar8._0_8_;
      if (auVar8._0_4_ < local_88) {
        auVar9._4_12_ = auVar8._4_12_;
        auVar9._0_4_ = local_88;
        nVar7 = auVar9._0_8_;
      }
      local_48 = nVar7.y + local_48;
      if (local_60 != (nk_vec2 *)0x0) {
        nVar10.y = local_48;
        nVar10.x = local_88;
        *local_60 = nVar10;
      }
      if (nVar7.y == 0.0 || 0.0 < local_88) {
        nVar7.y = local_48;
      }
      if (local_58 != (char **)0x0) {
        *local_58 = local_90 + (lVar4 >> 0x20);
      }
    }
  }
  return nVar7;
}

Assistant:

NK_LIB struct nk_vec2
nk_text_calculate_text_bounds(const struct nk_user_font *font,
    const char *begin, int byte_len, float row_height, const char **remaining,
    struct nk_vec2 *out_offset, int *glyphs, int op)
{
    float line_height = row_height;
    struct nk_vec2 text_size = nk_vec2(0,0);
    float line_width = 0.0f;

    float glyph_width;
    int glyph_len = 0;
    nk_rune unicode = 0;
    int text_len = 0;
    if (!begin || byte_len <= 0 || !font)
        return nk_vec2(0,row_height);

    glyph_len = nk_utf_decode(begin, &unicode, byte_len);
    if (!glyph_len) return text_size;
    glyph_width = font->width(font->userdata, font->height, begin, glyph_len);

    *glyphs = 0;
    while ((text_len < byte_len) && glyph_len) {
        if (unicode == '\n') {
            text_size.x = NK_MAX(text_size.x, line_width);
            text_size.y += line_height;
            line_width = 0;
            *glyphs+=1;
            if (op == NK_STOP_ON_NEW_LINE)
                break;

            text_len++;
            glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
            continue;
        }

        if (unicode == '\r') {
            text_len++;
            *glyphs+=1;
            glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
            continue;
        }

        *glyphs = *glyphs + 1;
        text_len += glyph_len;
        line_width += (float)glyph_width;
        glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
        glyph_width = font->width(font->userdata, font->height, begin+text_len, glyph_len);
        continue;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;
    if (out_offset)
        *out_offset = nk_vec2(line_width, text_size.y + line_height);
    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;
    if (remaining)
        *remaining = begin+text_len;
    return text_size;
}